

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::MergeFrom
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,
          TreeEnsembleParameters_TreeNode_EvaluationInfo *from)

{
  LogMessage *other;
  uint64_t uVar1;
  double dVar2;
  uint64_t raw_evaluationvalue;
  double tmp_evaluationvalue;
  LogFinisher local_65;
  uint32_t cached_has_bits;
  byte local_51;
  LogMessage local_50;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *local_18;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *from_local;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x1a4);
    local_51 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_65,other);
  }
  if ((local_51 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  uVar1 = _internal_evaluationindex(local_18);
  if (uVar1 != 0) {
    uVar1 = _internal_evaluationindex(local_18);
    _internal_set_evaluationindex(this,uVar1);
  }
  dVar2 = _internal_evaluationvalue(local_18);
  if (dVar2 != 0.0) {
    dVar2 = _internal_evaluationvalue(local_18);
    _internal_set_evaluationvalue(this,dVar2);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(local_18->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode_EvaluationInfo::MergeFrom(const TreeEnsembleParameters_TreeNode_EvaluationInfo& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (from._internal_evaluationindex() != 0) {
    _internal_set_evaluationindex(from._internal_evaluationindex());
  }
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_evaluationvalue = from._internal_evaluationvalue();
  uint64_t raw_evaluationvalue;
  memcpy(&raw_evaluationvalue, &tmp_evaluationvalue, sizeof(tmp_evaluationvalue));
  if (raw_evaluationvalue != 0) {
    _internal_set_evaluationvalue(from._internal_evaluationvalue());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}